

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.h
# Opt level: O3

void __thiscall Kumu::ILogSink::WriteEntryToListeners(ILogSink *this,LogEntry *entry)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_listeners)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 1) + 0x18))(*(long **)(p_Var1 + 1),entry);
  }
  return;
}

Assistant:

void WriteEntryToListeners(const LogEntry& entry)
      {
	std::set<ILogSink*>::iterator i;
	for ( i = m_listeners.begin(); i != m_listeners.end(); ++i )
	  (*i)->WriteEntry(entry);
      }